

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O2

int fd_gets(BIO *bp,char *buf,int size)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *out;
  
  if (size < 1) {
    return 0;
  }
  out = buf;
  do {
    pcVar3 = out;
    if ((buf + ((ulong)(uint)size - 1) <= out) || (iVar2 = fd_read(bp,out,1), iVar2 < 1)) break;
    pcVar3 = out + 1;
    cVar1 = *out;
    out = pcVar3;
  } while (cVar1 != '\n');
  *pcVar3 = '\0';
  return (int)pcVar3 - (int)buf;
}

Assistant:

static int fd_gets(BIO *bp, char *buf, int size) {
  if (size <= 0) {
    return 0;
  }

  char *ptr = buf;
  char *end = buf + size - 1;
  while (ptr < end && fd_read(bp, ptr, 1) > 0) {
    char c = ptr[0];
    ptr++;
    if (c == '\n') {
      break;
    }
  }

  ptr[0] = '\0';

  // The output length is bounded by |size|.
  return (int)(ptr - buf);
}